

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O0

gears_engine_t * gears_engine_new(char *name)

{
  int iVar1;
  gears_engine_t *pgVar2;
  list *local_30;
  list *engine_entry;
  engine_t *engine;
  gears_engine_t *gears_engine;
  char *name_local;
  
  local_30 = engine_list.next;
  while( true ) {
    if (local_30 == &engine_list) {
      return (gears_engine_t *)0x0;
    }
    iVar1 = strcmp((char *)local_30[-3].prev,name);
    if (iVar1 == 0) break;
    local_30 = local_30->next;
  }
  pgVar2 = (gears_engine_t *)calloc(1,0x10);
  if (pgVar2 == (gears_engine_t *)0x0) {
    printf("calloc gears_engine failed\n");
    return (gears_engine_t *)0x0;
  }
  pgVar2->engine = (engine_t *)&local_30[-3].prev;
  return pgVar2;
}

Assistant:

gears_engine_t *gears_engine_new(char *name)
{
  gears_engine_t *gears_engine = NULL;
  engine_t *engine = NULL;
  struct list *engine_entry = NULL;

  LIST_FOR_EACH(engine_entry, &engine_list) {
    engine = LIST_ENTRY(engine_entry, engine_t, entry);
    if (!strcmp(engine->name, name)) {
      gears_engine = calloc(1, sizeof(gears_engine_t));
      if (!gears_engine) {
        printf("calloc gears_engine failed\n");
        return NULL;
      }
      gears_engine->engine = engine;
      return gears_engine;
    }
  }

  return NULL;
}